

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

char * kj::_::
       fill<kj::ArrayPtr<char_const>,kj::StringPtr_const&,kj::ArrayPtr<char_const>&,kj::StringPtr_const&>
                 (char *target,ArrayPtr<const_char> *first,StringPtr *rest,
                 ArrayPtr<const_char> *rest_1,StringPtr *rest_2)

{
  size_t sVar1;
  char *pcVar2;
  size_t sVar3;
  
  sVar1 = first->size_;
  if (sVar1 != 0) {
    memcpy(target,first->ptr,sVar1);
    target = target + sVar1;
  }
  pcVar2 = (rest->content).ptr;
  sVar3 = (rest->content).size_;
  if (pcVar2 != pcVar2 + (sVar3 - 1)) {
    memcpy(target,pcVar2,sVar3 - 1);
    target = target + (sVar3 - 1);
  }
  sVar1 = rest_1->size_;
  if (sVar1 != 0) {
    memcpy(target,rest_1->ptr,sVar1);
    target = target + sVar1;
  }
  pcVar2 = (rest_2->content).ptr;
  sVar3 = (rest_2->content).size_;
  if (pcVar2 != pcVar2 + (sVar3 - 1)) {
    memcpy(target,pcVar2,sVar3 - 1);
    target = target + (sVar3 - 1);
  }
  return target;
}

Assistant:

char* fill(char* __restrict__ target, const First& first, Rest&&... rest) {
  auto i = first.begin();
  auto end = first.end();
  while (i != end) {
    *target++ = *i++;
  }
  return fill(target, kj::fwd<Rest>(rest)...);
}